

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

ostream * pstore::repo::operator<<(ostream *os,section_kind kind)

{
  ostream *poVar1;
  char *local_20;
  char *str;
  section_kind kind_local;
  ostream *os_local;
  
  local_20 = "unknown section_kind";
  switch(kind) {
  case text:
    local_20 = "text";
    break;
  case data:
    local_20 = "data";
    break;
  case bss:
    local_20 = "bss";
    break;
  case rel_ro:
    local_20 = "rel_ro";
    break;
  case mergeable_1_byte_c_string:
    local_20 = "mergeable_1_byte_c_string";
    break;
  case mergeable_2_byte_c_string:
    local_20 = "mergeable_2_byte_c_string";
    break;
  case mergeable_4_byte_c_string:
    local_20 = "mergeable_4_byte_c_string";
    break;
  case mergeable_const_4:
    local_20 = "mergeable_const_4";
    break;
  case mergeable_const_8:
    local_20 = "mergeable_const_8";
    break;
  case mergeable_const_16:
    local_20 = "mergeable_const_16";
    break;
  case mergeable_const_32:
    local_20 = "mergeable_const_32";
    break;
  case read_only:
    local_20 = "read_only";
    break;
  case thread_data:
    local_20 = "thread_data";
    break;
  case thread_bss:
    local_20 = "thread_bss";
    break;
  case debug_line:
    local_20 = "debug_line";
    break;
  case debug_loc:
    local_20 = "debug_loc";
    break;
  case debug_string:
    local_20 = "debug_string";
    break;
  case debug_ranges:
    local_20 = "debug_ranges";
    break;
  case linked_definitions:
    local_20 = "linked_definitions";
    break;
  case last:
  }
  poVar1 = std::operator<<(os,local_20);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, section_kind const kind) {
            auto str = "unknown section_kind";
#define X(a)                                                                                       \
    case section_kind::a: str = #a; break;
            switch (kind) {
                PSTORE_MCREPO_SECTION_KINDS
            case section_kind::last: break;
            }
            return os << str;
#undef X
        }